

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_filter.cpp
# Opt level: O2

void __thiscall CServerBrowserFilter::CServerFilter::Filter(CServerFilter *this)

{
  char *needle;
  char cVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  CConfig *pCVar5;
  long lVar6;
  byte bVar7;
  int iVar8;
  int *piVar9;
  char *pcVar10;
  CServerBrowserFilter *pCVar11;
  byte bVar12;
  CServerEntry *pCVar13;
  int p;
  long lVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  
  uVar2 = this->m_pServerBrowserFilter->m_NumServers;
  this->m_NumSortedPlayers = 0;
  this->m_NumSortedServers = 0;
  if (this->m_SortedServersCapacity < (int)uVar2) {
    if (this->m_pSortedServerlist != (int *)0x0) {
      mem_free(this->m_pSortedServerlist);
    }
    iVar8 = (int)uVar2 / 2 + uVar2;
    iVar15 = 1000;
    if (1000 < iVar8) {
      iVar15 = iVar8;
    }
    this->m_SortedServersCapacity = iVar15;
    piVar9 = (int *)mem_alloc(iVar15 << 2);
    this->m_pSortedServerlist = piVar9;
  }
  needle = (this->m_FilterInfo).m_aAddress;
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  uVar16 = 0;
  do {
    if (uVar16 == uVar2) {
      return;
    }
    uVar3 = (this->m_FilterInfo).m_SortHash;
    pCVar11 = this->m_pServerBrowserFilter;
    pCVar13 = pCVar11->m_ppServerlist[uVar16];
    bVar12 = (byte)uVar3;
    iVar15 = *(int *)((long)(&(pCVar13->m_Info).m_NetAddr + 1) + ((ulong)(bVar12 >> 7) * 2 + 3) * 4)
    ;
    if (((uVar3 & 0x10) != 0) &&
       (iVar15 = iVar15 - (pCVar13->m_Info).m_NumBotPlayers, -1 < (char)bVar12)) {
      iVar15 = iVar15 - (pCVar13->m_Info).m_NumBotSpectators;
    }
    if (((((((uVar3 & 0x20) == 0) || (iVar15 != 0)) &&
          (((uVar3 & 0x40) == 0 ||
           (((-1 < (char)bVar12 ||
             ((pCVar13->m_Info).m_NumPlayers != (pCVar13->m_Info).m_MaxPlayers)) &&
            ((pCVar13->m_Info).m_NumClients != (pCVar13->m_Info).m_MaxClients)))))) &&
         (((uVar3 >> 9 & 1) == 0 || (((pCVar13->m_Info).m_Flags & 1) == 0)))) &&
        (((uVar3 >> 10 & 1) == 0 || ((pCVar13->m_Info).m_Favorite == true)))) &&
       (((((uVar3 >> 0xc & 1) == 0 || (((pCVar13->m_Info).m_Flags & 2) != 0)) &&
         (((uVar3 >> 0xd & 1) == 0 || (((pCVar13->m_Info).m_Flags & 4) != 0)))) &&
        ((pCVar13->m_Info).m_Latency <= (this->m_FilterInfo).m_Ping)))) {
      if ((uVar3 >> 0xb & 1) != 0) {
        iVar8 = str_comp_num((pCVar13->m_Info).m_aVersion,pCVar11->m_aNetVersion,3);
        if (iVar8 != 0) goto LAB_001245fd;
        pCVar11 = this->m_pServerBrowserFilter;
      }
      if (*needle != '\0') {
        pcVar10 = str_find_nocase((pCVar11->m_ppServerlist[uVar16]->m_Info).m_aAddress,needle);
        if (pcVar10 == (char *)0x0) goto LAB_001245fd;
        pCVar11 = this->m_pServerBrowserFilter;
      }
      if (((uint)(this->m_FilterInfo).m_ServerLevel >>
           ((pCVar11->m_ppServerlist[uVar16]->m_Info).m_ServerLevel & 0x1fU) & 1) == 0) {
        if ((this->m_FilterInfo).m_aGametype[0][0] != '\0') {
          bVar12 = 0;
          pcVar10 = (this->m_FilterInfo).m_aGametypeExclusive;
          for (lVar14 = 0x18;
              (lVar14 != 0x98 &&
              (*(char *)((long)((this->m_FilterInfo).m_aGametype + -2) + 8 + lVar14) != '\0'));
              lVar14 = lVar14 + 0x10) {
            cVar1 = *pcVar10;
            iVar8 = str_comp_nocase((this->m_pServerBrowserFilter->m_ppServerlist[uVar16]->m_Info).
                                    m_aGameType,
                                    (char *)((long)((this->m_FilterInfo).m_aGametype + -2) + 8 +
                                            lVar14));
            if (cVar1 == '\0') {
              bVar12 = 1;
              if (iVar8 == 0) {
                bVar7 = 0;
                goto LAB_00124745;
              }
            }
            else if (iVar8 == 0) goto LAB_001245fd;
            pcVar10 = pcVar10 + 1;
          }
          bVar7 = 1;
LAB_00124745:
          if ((bool)(bVar7 & bVar12)) goto LAB_001245fd;
          pCVar11 = this->m_pServerBrowserFilter;
        }
        if (((this->m_FilterInfo).m_SortHash & 0x4000) != 0) {
          uVar3 = (pCVar11->m_ppServerlist[uVar16]->m_Info).m_NumClients;
          if ((int)uVar3 < 1) {
            uVar3 = 0;
          }
          lVar14 = 0;
          do {
            if ((ulong)uVar3 * 0x84 + 0x84 == lVar14 + 0x84) goto LAB_001245fd;
            lVar17 = lVar14 + 0x33;
            lVar14 = lVar14 + 0x84;
          } while (*(int *)((pCVar11->m_ppServerlist[uVar16]->m_Info).m_aClients[0].m_aClan + lVar17
                           ) != (this->m_FilterInfo).m_Country);
        }
        pCVar5 = pCVar11->m_pConfig;
        if (pCVar5->m_BrFilterString[0] != '\0') {
          pCVar13 = pCVar11->m_ppServerlist[uVar16];
          (pCVar13->m_Info).m_QuickSearchHit = 0;
          pcVar10 = str_find_nocase((pCVar13->m_Info).m_aName,pCVar5->m_BrFilterString);
          bVar18 = pcVar10 == (char *)0x0;
          if (!bVar18) {
            piVar9 = &(this->m_pServerBrowserFilter->m_ppServerlist[uVar16]->m_Info).
                      m_QuickSearchHit;
            *piVar9 = *piVar9 | 1;
          }
          lVar17 = 0x1b8;
          lVar14 = -1;
          do {
            pCVar11 = this->m_pServerBrowserFilter;
            pCVar13 = pCVar11->m_ppServerlist[uVar16];
            lVar14 = lVar14 + 1;
            if ((pCVar13->m_Info).m_NumClients <= lVar14) goto LAB_00124881;
            pcVar10 = str_find_nocase((char *)((pCVar13->m_Addr).ip + lVar17 + -4),
                                      pCVar11->m_pConfig->m_BrFilterString);
            if (pcVar10 != (char *)0x0) break;
            lVar6 = lVar17 + 0xd;
            lVar17 = lVar17 + 0x84;
            pcVar10 = str_find_nocase((char *)((this->m_pServerBrowserFilter->m_ppServerlist[uVar16]
                                               ->m_Info).m_NetAddr.ip + lVar6),
                                      this->m_pServerBrowserFilter->m_pConfig->m_BrFilterString);
          } while (pcVar10 == (char *)0x0);
          pCVar11 = this->m_pServerBrowserFilter;
          pCVar13 = pCVar11->m_ppServerlist[uVar16];
          piVar9 = &(pCVar13->m_Info).m_QuickSearchHit;
          *piVar9 = *piVar9 | 2;
          bVar18 = false;
LAB_00124881:
          pcVar10 = str_find_nocase((pCVar13->m_Info).m_aMap,pCVar11->m_pConfig->m_BrFilterString);
          pCVar11 = this->m_pServerBrowserFilter;
          pCVar13 = pCVar11->m_ppServerlist[uVar16];
          if (pcVar10 != (char *)0x0) {
            piVar9 = &(pCVar13->m_Info).m_QuickSearchHit;
            *(byte *)piVar9 = (byte)*piVar9 | 4;
            bVar18 = false;
          }
          pcVar10 = str_find_nocase((pCVar13->m_Info).m_aGameType,
                                    pCVar11->m_pConfig->m_BrFilterString);
          if (pcVar10 == (char *)0x0) {
            if (bVar18) goto LAB_001245fd;
            pCVar11 = this->m_pServerBrowserFilter;
          }
          else {
            pCVar11 = this->m_pServerBrowserFilter;
            piVar9 = &(pCVar11->m_ppServerlist[uVar16]->m_Info).m_QuickSearchHit;
            *piVar9 = *piVar9 | 8;
          }
        }
        pCVar13 = pCVar11->m_ppServerlist[uVar16];
        (pCVar13->m_Info).m_FriendState = 0;
        iVar8 = 0;
        lVar17 = 0x1b8;
        for (lVar14 = 0; lVar14 < (pCVar13->m_Info).m_NumClients; lVar14 = lVar14 + 1) {
          iVar8 = (*(pCVar11->m_pFriends->super_IInterface)._vptr_IInterface[5])
                            (pCVar11->m_pFriends,(pCVar13->m_Addr).ip + lVar17 + -4,
                             (pCVar13->m_Info).m_NetAddr.ip + lVar17 + 0xd);
          pCVar11 = this->m_pServerBrowserFilter;
          pCVar13 = pCVar11->m_ppServerlist[uVar16];
          *(int *)((pCVar13->m_Info).m_aGameType + lVar17 + 8) = iVar8;
          iVar4 = (pCVar13->m_Info).m_FriendState;
          if (iVar8 < iVar4) {
            iVar8 = iVar4;
          }
          (pCVar13->m_Info).m_FriendState = iVar8;
          lVar17 = lVar17 + 0x84;
        }
        if ((((this->m_FilterInfo).m_SortHash & 0x100) == 0) || (iVar8 != 0)) {
          iVar8 = this->m_NumSortedServers;
          this->m_NumSortedServers = iVar8 + 1;
          this->m_pSortedServerlist[iVar8] = (int)uVar16;
          this->m_NumSortedPlayers = this->m_NumSortedPlayers + iVar15;
        }
      }
    }
LAB_001245fd:
    uVar16 = uVar16 + 1;
  } while( true );
}

Assistant:

void CServerBrowserFilter::CServerFilter::Filter()
{
	int NumServers = m_pServerBrowserFilter->m_NumServers;
	m_NumSortedServers = 0;
	m_NumSortedPlayers = 0;

	// allocate the sorted list
	if(m_SortedServersCapacity < NumServers)
	{
		if(m_pSortedServerlist)
			mem_free(m_pSortedServerlist);
		m_SortedServersCapacity = maximum(1000, NumServers+NumServers/2);
		m_pSortedServerlist = (int *)mem_alloc(m_SortedServersCapacity*sizeof(int));
	}

	// filter the servers
	for(int i = 0; i < NumServers; i++)
	{
		int Filtered = 0;

		int RelevantClientCount = (m_FilterInfo.m_SortHash&IServerBrowser::FILTER_SPECTATORS) ? m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumPlayers : m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumClients;
		if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_BOTS)
		{
			RelevantClientCount -= m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumBotPlayers;
			if(!(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_SPECTATORS))
				RelevantClientCount -= m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumBotSpectators;
		}

		if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_EMPTY && RelevantClientCount == 0)
			Filtered = 1;
		else if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_FULL && ((m_FilterInfo.m_SortHash&IServerBrowser::FILTER_SPECTATORS && m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumPlayers == m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_MaxPlayers) ||
				m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumClients == m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_MaxClients))
			Filtered = 1;
		else if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_PW && m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_Flags&IServerBrowser::FLAG_PASSWORD)
			Filtered = 1;
		else if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_FAVORITE && !m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_Favorite)
			Filtered = 1;
		else if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_PURE && !(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_Flags&IServerBrowser::FLAG_PURE))
			Filtered = 1;
		else if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_PURE_MAP &&  !(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_Flags&IServerBrowser::FLAG_PUREMAP))
			Filtered = 1;
		else if(m_FilterInfo.m_Ping < m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_Latency)
			Filtered = 1;
		else if(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_COMPAT_VERSION && str_comp_num(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aVersion, m_pServerBrowserFilter->m_aNetVersion, 3) != 0)
			Filtered = 1;
		else if(m_FilterInfo.m_aAddress[0] && !str_find_nocase(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aAddress, m_FilterInfo.m_aAddress))
			Filtered = 1;
		else if(m_FilterInfo.IsLevelFiltered(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_ServerLevel))
			Filtered = 1;
		else
		{
			if(m_FilterInfo.m_aGametype[0][0])
			{
				bool Excluded = false, DoInclude = false, Included = false;
				for(int Index = 0; Index < CServerFilterInfo::MAX_GAMETYPES; ++Index)
				{
					if(!m_FilterInfo.m_aGametype[Index][0])
						break;
					if(m_FilterInfo.m_aGametypeExclusive[Index])
					{
						if(!str_comp_nocase(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aGameType, m_FilterInfo.m_aGametype[Index]))
						{
							Excluded = true;
							break;
						}
					}
					else
					{
						DoInclude = true;
						if(!str_comp_nocase(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aGameType, m_FilterInfo.m_aGametype[Index]))
						{
							Included = true;
							break;
						}
					}
				}
				Filtered = Excluded || (DoInclude && !Included);
			}

			if(!Filtered && m_FilterInfo.m_SortHash&IServerBrowser::FILTER_COUNTRY)
			{
				Filtered = 1;
				// match against player country
				for(int p = 0; p < m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumClients; p++)
				{
					if(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aClients[p].m_Country == m_FilterInfo.m_Country)
					{
						Filtered = 0;
						break;
					}
				}
			}

			if(!Filtered && Config()->m_BrFilterString[0] != 0)
			{
				int MatchFound = 0;

				m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_QuickSearchHit = 0;

				// match against server name
				if(str_find_nocase(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aName, Config()->m_BrFilterString))
				{
					MatchFound = 1;
					m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_QuickSearchHit |= IServerBrowser::QUICK_SERVERNAME;
				}

				// match against players
				for(int p = 0; p < m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumClients; p++)
				{
					if(str_find_nocase(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aClients[p].m_aName, Config()->m_BrFilterString) ||
						str_find_nocase(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aClients[p].m_aClan, Config()->m_BrFilterString))
					{
						MatchFound = 1;
						m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_QuickSearchHit |= IServerBrowser::QUICK_PLAYER;
						break;
					}
				}

				// match against map
				if(str_find_nocase(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aMap, Config()->m_BrFilterString))
				{
					MatchFound = 1;
					m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_QuickSearchHit |= IServerBrowser::QUICK_MAPNAME;
				}

				// match against game type
				if(str_find_nocase(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aGameType, Config()->m_BrFilterString))
				{
					MatchFound = 1;
					m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_QuickSearchHit |= IServerBrowser::QUICK_GAMETYPE;
				}

				if(!MatchFound)
					Filtered = 1;
			}
		}

		if(Filtered == 0)
		{
			// check for friend
			m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_FriendState = CContactInfo::CONTACT_NO;
			for(int p = 0; p < m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_NumClients; p++)
			{
				m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aClients[p].m_FriendState = m_pServerBrowserFilter->m_pFriends->GetFriendState(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aClients[p].m_aName,
					m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aClients[p].m_aClan);
				m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_FriendState = maximum(m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_FriendState, m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_aClients[p].m_FriendState);
			}

			if(!(m_FilterInfo.m_SortHash&IServerBrowser::FILTER_FRIENDS) || m_pServerBrowserFilter->m_ppServerlist[i]->m_Info.m_FriendState != CContactInfo::CONTACT_NO)
			{
				m_pSortedServerlist[m_NumSortedServers++] = i;
				m_NumSortedPlayers += RelevantClientCount;
			}
		}
	}
}